

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

bool __thiscall QRenderRule::hasModification(QRenderRule *this)

{
  QStyleSheetBackgroundData *pQVar1;
  QStyleSheetBorderData *pQVar2;
  QStyleSheetOutlineData *pQVar3;
  Data *pDVar4;
  char cVar5;
  bool bVar6;
  
  bVar6 = true;
  if ((this->pal).d.ptr == (QStyleSheetPaletteData *)0x0) {
    if ((this->bg).d.ptr != (QStyleSheetBackgroundData *)0x0) {
      cVar5 = QPixmap::isNull();
      if (cVar5 == '\0') {
        return true;
      }
      if (*(int *)(*(long *)&((this->bg).d.ptr)->brush + 4) != 0) {
        return true;
      }
    }
    pQVar1 = (this->bg).d.ptr;
    if (((((pQVar1 == (QStyleSheetBackgroundData *)0x0) ||
          (2 < *(int *)(*(long *)&pQVar1->brush + 4) - 0xfU)) &&
         ((pQVar2 = (this->bd).d.ptr, pQVar2 == (QStyleSheetBorderData *)0x0 ||
          (((pQVar2->bi).d.ptr == (QStyleSheetBorderImageData *)0x0 &&
           (pQVar2->styles[0] == BorderStyle_Native)))))) &&
        ((pQVar3 = (this->ou).d.ptr, pQVar3 == (QStyleSheetOutlineData *)0x0 ||
         (((pQVar3->super_QStyleSheetBorderData).bi.d.ptr == (QStyleSheetBorderImageData *)0x0 &&
          ((pQVar3->super_QStyleSheetBorderData).styles[0] == BorderStyle_Native)))))) &&
       ((((this->b).d.ptr == (QStyleSheetBoxData *)0x0 &&
         ((((this->p).d.ptr == (QStyleSheetPositionData *)0x0 &&
           ((this->geo).d.ptr == (QStyleSheetGeometryData *)0x0)) &&
          ((this->img).d.ptr == (QStyleSheetImageData *)0x0)))) && (this->hasFont == false)))) {
      pDVar4 = (this->styleHints).d;
      if (pDVar4 == (Data *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = pDVar4->size != 0;
      }
    }
  }
  return bVar6;
}

Assistant:

bool QRenderRule::hasModification() const
{
    return hasPalette() ||
           hasBackground() ||
           hasGradientBackground() ||
           !hasNativeBorder() ||
           !hasNativeOutline() ||
           hasBox() ||
           hasPosition() ||
           hasGeometry() ||
           hasImage() ||
           hasFont ||
           !styleHints.isEmpty();
}